

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_pkh_extkey_derive_Test::~Descriptor_Parse_pkh_extkey_derive_Test
          (Descriptor_Parse_pkh_extkey_derive_Test *this)

{
  Descriptor_Parse_pkh_extkey_derive_Test *this_local;
  
  ~Descriptor_Parse_pkh_extkey_derive_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, Parse_pkh_extkey_derive) {
  std::string descriptor = "pkh([d34db33f/44'/0'/0']xpub6ERApfZwUNrhLCkDtcHTcxd75RbzS1ed54G1LkBUHQVHQKqhMkhgbmJbZRkrgZw4koxb5JaHWkY4ALHY2grBGRjaDMzQLcgJvLJuZZvRcEL/1/*)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript("0"));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript("0/44"));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_DUP OP_HASH160 2a05c214617c9b0434c92d0583200a85ef61818f OP_EQUALVERIFY OP_CHECKSIG");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "OP_DUP OP_HASH160 c463e6dedb2b780434e60fcee3f2d0a0fbcbbc90 OP_EQUALVERIFY OP_CHECKSIG");
  try {
    auto key = desc.GetKeyData("0");
    EXPECT_TRUE(key.IsValid());
    EXPECT_STREQ(key.ToString().c_str(),
      "[d34db33f/44'/0'/0'/1/0]03095e95d8c50ae3f3fea93fa8e983f710489f60ff681a658c06eba64622c824b1");
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}